

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O2

void __thiscall KryoFlux::SamBaCommand(KryoFlux *this,string *cmd,string *end)

{
  string *psVar1;
  int iVar2;
  string s;
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  uint8_t buf [512];
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  (**(code **)(*(long *)this + 0x28))(this,(cmd->_M_dataplus)._M_p,(int)cmd->_M_string_length);
  if (end->_M_string_length != 0) {
    do {
      do {
        iVar2 = (**(code **)(*(long *)this + 0x20))(this,buf,0x200);
        local_258[0] = local_248;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,buf,buf + iVar2);
        std::__cxx11::string::append((string *)&s);
        std::__cxx11::string::~string((string *)local_258);
        psVar1 = (string *)end->_M_string_length;
      } while (s._M_string_length < psVar1);
      iVar2 = std::__cxx11::string::compare((ulong)&s,s._M_string_length - (long)psVar1,psVar1);
    } while (iVar2 != 0);
  }
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void KryoFlux::SamBaCommand(const std::string& cmd, const std::string& end)
{
    std::string s;
    uint8_t buf[512];

    try
    {
        Write(cmd.c_str(), static_cast<int>(cmd.length()));

        if (!end.empty())
        {
            for (;;)
            {
                auto len = Read(buf, sizeof(buf));

                s += std::string(reinterpret_cast<char*>(buf), len);

                if (s.length() >= end.length() &&
                    s.compare(s.length() - end.length(), end.length(), end) == 0)
                {
                    break;
                }
            }
        }
    }
    catch (...)
    {
        throw util::exception("firmware upload failed, try resetting device");
    }
}